

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

void __thiscall TRM::Edge::set_top(Edge *this,Vertex *v)

{
  Vertex *v_local;
  Edge *this_local;
  
  LinkedList<TRM::Edge>::Remove<&TRM::Edge::below_prev,&TRM::Edge::below_next>
            (this,(Edge **)(this->top + 0x28),(Edge **)(this->top + 0x30));
  this->top = v;
  recompute(this);
  Vertex::insert_below(this->top,this);
  return;
}

Assistant:

void Edge::set_top(Vertex* v) {
  // remove this edge from top's below list
  LinkedList<Edge>::Remove<&Edge::below_prev, &Edge::below_next>(
      this, &top->edge_below.head, &top->edge_below.tail);
  // update top vertex
  top = v;
  // recompute line equation
  recompute();
  // insert self to new top's below list
  top->insert_below(this);
}